

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

bool __thiscall CCoinsViewMemPool::GetCoin(CCoinsViewMemPool *this,COutPoint *outpoint,Coin *coin)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CTransactionRef ptx;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  Coin *in_stack_ffffffffffffff38;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CTxMemPool *in_stack_ffffffffffffff70;
  bool local_69;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  unordered_map<COutPoint,_Coin,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::find((unordered_map<COutPoint,_Coin,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *)CONCAT17(in_stack_ffffffffffffff37,
                     CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
         (key_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  unordered_map<COutPoint,_Coin,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::end((unordered_map<COutPoint,_Coin,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
         *)CONCAT17(in_stack_ffffffffffffff37,
                    CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false> *)
                     in_stack_ffffffffffffff38,
                     (_Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false> *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    CTxMemPool::get(in_stack_ffffffffffffff70,
                    (uint256 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (bVar2) {
      uVar1 = *(uint *)(in_RSI + 0x20);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      sVar4 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (uVar1 < sVar4) {
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff38,
                   CONCAT17(in_stack_ffffffffffffff37,
                            CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
        Coin::Coin(in_stack_ffffffffffffff38,
                   (CTxOut *)
                   CONCAT17(in_stack_ffffffffffffff37,
                            CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                   in_stack_ffffffffffffff2c,SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
        this_00 = (unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                   *)&stack0xffffffffffffffc8;
        Coin::operator=((Coin *)this_00,
                        (Coin *)CONCAT17(in_stack_ffffffffffffff37,
                                         CONCAT16(in_stack_ffffffffffffff36,
                                                  in_stack_ffffffffffffff30)));
        Coin::~Coin((Coin *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        std::
        unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>
        ::emplace<COutPoint_const&>
                  (this_00,(COutPoint *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
        local_69 = true;
      }
      else {
        local_69 = false;
      }
    }
    else {
      bVar3 = (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),in_RSI,in_RDX)
      ;
      local_69 = (bool)(bVar3 & 1);
    }
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  else {
    std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_Coin>,_false,_false>::operator->
              ((_Node_const_iterator<std::pair<const_COutPoint,_Coin>,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    Coin::operator=(in_stack_ffffffffffffff38,
                    (Coin *)CONCAT17(in_stack_ffffffffffffff37,
                                     CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)))
    ;
    local_69 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewMemPool::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    // Check to see if the inputs are made available by another tx in the package.
    // These Coins would not be available in the underlying CoinsView.
    if (auto it = m_temp_added.find(outpoint); it != m_temp_added.end()) {
        coin = it->second;
        return true;
    }

    // If an entry in the mempool exists, always return that one, as it's guaranteed to never
    // conflict with the underlying cache, and it cannot have pruned entries (as it contains full)
    // transactions. First checking the underlying cache risks returning a pruned entry instead.
    CTransactionRef ptx = mempool.get(outpoint.hash);
    if (ptx) {
        if (outpoint.n < ptx->vout.size()) {
            coin = Coin(ptx->vout[outpoint.n], MEMPOOL_HEIGHT, false);
            m_non_base_coins.emplace(outpoint);
            return true;
        } else {
            return false;
        }
    }
    return base->GetCoin(outpoint, coin);
}